

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O1

int __thiscall EncodingTable::searchStringMatch(EncodingTable *this,wstring *str,size_t pos)

{
  pointer pTVar1;
  ulong uVar2;
  pointer pwVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  pTVar1 = (this->entries).
           super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->entries).
                super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1;
  if (lVar8 == 0) {
    return -1;
  }
  lVar8 = lVar8 >> 5;
  uVar6 = 0xffffffff;
  uVar7 = 0;
  uVar9 = 0;
  do {
    uVar2 = pTVar1[uVar9].valueLen;
    pwVar3 = (this->valueData)._M_dataplus._M_p;
    uVar4 = uVar2;
    sVar5 = pos;
    if (uVar7 <= uVar2) {
      for (; uVar4 != 0; uVar4 = uVar4 - 1) {
        if ((str->_M_string_length <= sVar5) ||
           (pwVar3[pTVar1[uVar9].valuePos] != (str->_M_dataplus)._M_p[sVar5])) goto LAB_0012d732;
        pwVar3 = pwVar3 + 1;
        sVar5 = sVar5 + 1;
      }
      uVar6 = uVar9 & 0xffffffff;
      uVar7 = uVar2;
    }
LAB_0012d732:
    uVar9 = uVar9 + 1;
    if (uVar9 == lVar8 + (ulong)(lVar8 == 0)) {
      return (int)uVar6;
    }
  } while( true );
}

Assistant:

int EncodingTable::searchStringMatch(const std::wstring& str, size_t pos)
{
	size_t longestLength = 0;
	int longestNum = -1;

	for (size_t i = 0; i < entries.size(); i++)
	{
		TableEntry& entry = entries[i];
		if (entry.valueLen < longestLength) continue;

		bool match = true;
		for (size_t k = 0; k < entry.valueLen; k++)
		{
			if (pos+k >= str.size() || valueData[entry.valuePos+k] != str[pos+k])
			{
				match = false;
				break;
			}
		}

		if (match)
		{
			longestLength = entry.valueLen;
			longestNum = (int) i;
		}
	}

	return longestNum;
}